

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

void JPCommonLabelMora_initialize
               (JPCommonLabelMora *m,char *mora,JPCommonLabelPhoneme *head,
               JPCommonLabelPhoneme *tail,JPCommonLabelMora *prev,JPCommonLabelMora *next,
               JPCommonLabelWord *up)

{
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pcVar1 = strdup(in_RSI);
  *in_RDI = pcVar1;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  in_RDI[5] = next;
  return;
}

Assistant:

static void JPCommonLabelMora_initialize(JPCommonLabelMora * m, const char *mora,
                                         JPCommonLabelPhoneme * head, JPCommonLabelPhoneme * tail,
                                         JPCommonLabelMora * prev, JPCommonLabelMora * next,
                                         JPCommonLabelWord * up)
{
   m->mora = strdup(mora);
   m->head = head;
   m->tail = tail;
   m->prev = prev;
   m->next = next;
   m->up = up;
}